

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_int16 *
ma_dr_flac_open_and_read_pcm_frames_s16
          (ma_dr_flac_read_proc onRead,ma_dr_flac_seek_proc onSeek,void *pUserData,uint *channelsOut
          ,uint *sampleRateOut,ma_uint64 *totalPCMFrameCountOut,
          ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_dr_flac *pFlac;
  ma_int16 *pmVar1;
  
  if (channelsOut != (uint *)0x0) {
    *channelsOut = 0;
  }
  if (sampleRateOut != (uint *)0x0) {
    *sampleRateOut = 0;
  }
  if (totalPCMFrameCountOut != (ma_uint64 *)0x0) {
    *totalPCMFrameCountOut = 0;
  }
  pFlac = ma_dr_flac_open_with_metadata_private
                    (onRead,onSeek,(ma_dr_flac_meta_proc)0x0,ma_dr_flac_container_unknown,pUserData,
                     pUserData,pAllocationCallbacks);
  if (pFlac != (ma_dr_flac *)0x0) {
    pmVar1 = ma_dr_flac__full_read_and_close_s16
                       (pFlac,channelsOut,sampleRateOut,totalPCMFrameCountOut);
    return pmVar1;
  }
  return (ma_int16 *)0x0;
}

Assistant:

MA_API ma_int16* ma_dr_flac_open_and_read_pcm_frames_s16(ma_dr_flac_read_proc onRead, ma_dr_flac_seek_proc onSeek, void* pUserData, unsigned int* channelsOut, unsigned int* sampleRateOut, ma_uint64* totalPCMFrameCountOut, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_dr_flac* pFlac;
    if (channelsOut) {
        *channelsOut = 0;
    }
    if (sampleRateOut) {
        *sampleRateOut = 0;
    }
    if (totalPCMFrameCountOut) {
        *totalPCMFrameCountOut = 0;
    }
    pFlac = ma_dr_flac_open(onRead, onSeek, pUserData, pAllocationCallbacks);
    if (pFlac == NULL) {
        return NULL;
    }
    return ma_dr_flac__full_read_and_close_s16(pFlac, channelsOut, sampleRateOut, totalPCMFrameCountOut);
}